

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arduino-rx-web.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  _Manager_type p_Var2;
  _Any_data _Var3;
  bool bVar4;
  int iVar5;
  void *__dest;
  const_iterator cVar6;
  mapped_type *pmVar7;
  int *piVar8;
  long lVar9;
  long *plVar10;
  undefined8 uVar11;
  int payloadLength;
  int captureId;
  bool isInitialized;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  _Any_data __tmp;
  _Any_data __tmp_1;
  _Any_data local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined4 local_b8;
  undefined4 local_b4;
  key_type local_b0;
  char *local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88 [8];
  _Rb_tree_node_base local_80 [2];
  
  local_d8._8_8_ = local_d8._M_unused._M_object;
  printf("Usage: %s [-cN] [-lN]\n",*argv);
  puts("    -cN - select capture device N");
  printf("    -lN - fixed payload length of size N, N in [1, %d]\n",0x40);
  putchar(10);
  __dest = (void *)GGWave::Protocols::rx();
  memcpy(__dest,&PTR_anon_var_dwarf_580b_00107bf8,0x160);
  parseCmdArguments_abi_cxx11_((int)local_88,(char **)(ulong)(uint)argc);
  local_d8._M_unused._M_object = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"c","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(local_88,(key_type *)&local_d8);
  if (cVar6._M_node == local_80) {
    lVar9 = 0;
LAB_0010428f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_unused._0_8_ != &local_c8) {
      operator_delete(local_d8._M_unused._M_object);
    }
    local_b4 = (undefined4)lVar9;
    local_d8._M_unused._M_object = &local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"l","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(local_88,(key_type *)&local_d8);
    if (cVar6._M_node == local_80) {
      lVar9 = 0x10;
LAB_0010437c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_unused._0_8_ != &local_c8) {
        operator_delete(local_d8._M_unused._M_object);
      }
      local_b8 = (undefined4)lVar9;
      local_b0._M_dataplus._M_p = local_b0._M_dataplus._M_p & 0xffffffffffffff00;
      local_d8._8_8_ = 0;
      plVar10 = (long *)operator_new(0x18);
      *plVar10 = (long)&local_b4;
      plVar10[1] = (long)&local_b8;
      plVar10[2] = (long)&local_b0;
      p_Var2 = g_doInit.super__Function_base._M_manager;
      local_d8._M_unused._M_object = plVar10;
      _Var3 = local_d8;
      local_d8 = g_doInit.super__Function_base._M_functor;
      g_doInit.super__Function_base._M_functor = _Var3;
      local_c8._M_allocated_capacity = (size_type)g_doInit.super__Function_base._M_manager;
      g_doInit.super__Function_base._M_manager =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/arduino-rx-web/arduino-rx-web.cpp:351:16)>
           ::_M_manager;
      local_c8._8_8_ = g_doInit._M_invoker;
      g_doInit._M_invoker =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/arduino-rx-web/arduino-rx-web.cpp:351:16)>
           ::_M_invoke;
      if (p_Var2 != (_Manager_type)0x0) {
        (*p_Var2)(&local_d8,&local_d8,__destroy_functor);
      }
      p_Var2 = g_mainUpdate.super__Function_base._M_manager;
      local_d8._8_8_ = 0;
      local_d8._M_unused._M_object = &local_b0;
      _Var3 = local_d8;
      local_d8 = g_mainUpdate.super__Function_base._M_functor;
      g_mainUpdate.super__Function_base._M_functor = _Var3;
      local_c8._M_allocated_capacity = (size_type)g_mainUpdate.super__Function_base._M_manager;
      g_mainUpdate.super__Function_base._M_manager =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/arduino-rx-web/arduino-rx-web.cpp:363:20)>
           ::_M_manager;
      local_c8._8_8_ = g_mainUpdate._M_invoker;
      g_mainUpdate._M_invoker =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/arduino-rx-web/arduino-rx-web.cpp:363:20)>
           ::_M_invoke;
      if (p_Var2 != (_Manager_type)0x0) {
        (*p_Var2)(&local_d8,&local_d8,__destroy_functor);
      }
      if (g_doInit.super__Function_base._M_manager != (_Manager_type)0x0) {
        bVar4 = (*g_doInit._M_invoker)((_Any_data *)&g_doInit);
        if (bVar4) {
          do {
            local_d8 = (_Any_data)(ZEXT816(1000000) << 0x40);
            do {
              iVar5 = nanosleep((timespec *)&local_d8,(timespec *)&local_d8);
              if (iVar5 != -1) break;
              piVar8 = __errno_location();
            } while (*piVar8 == 4);
            if (g_mainUpdate.super__Function_base._M_manager == (_Manager_type)0x0)
            goto LAB_00104536;
            bVar4 = (*g_mainUpdate._M_invoker)((_Any_data *)&g_mainUpdate);
          } while (bVar4);
          GGWave_deinit();
          SDL_CloseAudio();
          iVar5 = 0;
          SDL_Quit();
        }
        else {
          puts("Error: failed to initialize audio");
          iVar5 = -2;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_88);
        return iVar5;
      }
LAB_00104536:
      std::__throw_bad_function_call();
LAB_0010453b:
      std::__throw_invalid_argument("stoi");
      goto LAB_00104547;
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"l","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_88,&local_b0);
    pcVar1 = (pmVar7->_M_dataplus)._M_p;
    piVar8 = __errno_location();
    iVar5 = *piVar8;
    *piVar8 = 0;
    lVar9 = strtol(pcVar1,&local_90,10);
    if (local_90 != pcVar1) {
      if ((lVar9 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) goto LAB_0010455f;
      if (*piVar8 == 0) {
        *piVar8 = iVar5;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      goto LAB_0010437c;
    }
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"c","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_88,&local_b0);
    pcVar1 = (pmVar7->_M_dataplus)._M_p;
    piVar8 = __errno_location();
    iVar5 = *piVar8;
    *piVar8 = 0;
    lVar9 = strtol(pcVar1,&local_90,10);
    if (local_90 == pcVar1) goto LAB_0010453b;
    if ((0xfffffffeffffffff < lVar9 - 0x80000000U) && (*piVar8 != 0x22)) {
      if (*piVar8 == 0) {
        *piVar8 = iVar5;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      goto LAB_0010428f;
    }
LAB_00104547:
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_0010455f:
  uVar11 = std::__throw_out_of_range("stoi");
  __clang_call_terminate(uVar11);
}

Assistant:

int main(int argc, char** argv) {
#ifdef __EMSCRIPTEN__
    printf("Build time: %s\n", BUILD_TIMESTAMP);
    printf("Press the Init button to start\n");

    if (argv[1]) {
        GGWave_setDefaultCaptureDeviceName(argv[1]);
    }
#else
    printf("Usage: %s [-cN] [-lN]\n", argv[0]);
    printf("    -cN - select capture device N\n");
    printf("    -lN - fixed payload length of size N, N in [1, %d]\n", GGWave::kMaxLengthFixed);
    printf("\n");
#endif

    GGWave::Protocols::rx() = { {
        { "[R2T2] Normal",      64,  9, 1, 2, true, },
        { "[R2T2] Fast",        64,  6, 1, 2, true, },
        { "[R2T2] Fastest",     64,  3, 1, 2, true, },
        { "[R2T2] Low Normal",  16,  9, 1, 2, true, },
        { "[R2T2] Low Fast",    16,  6, 1, 2, true, },
        { "[R2T2] Low Fastest", 16,  3, 1, 2, true, },
    } };

    const auto argm = parseCmdArguments(argc, argv);
    const int captureId = argm.count("c") == 0 ? 0 : std::stoi(argm.at("c"));
    const int payloadLength = argm.count("l") == 0 ? 16 : std::stoi(argm.at("l"));

    bool isInitialized = false;

    g_doInit = [&]() {
        if (GGWave_init(0, captureId, payloadLength, 0, true) == false) {
            fprintf(stderr, "Failed to initialize GGWave\n");
            return false;
        }

        isInitialized = true;
        printf("Listening for payload with length = %d bytes ..\n", payloadLength);

        return true;
    };

    g_mainUpdate = [&]() {
        if (isInitialized == false) {
            return true;
        }

        GGWave_mainLoop();

        return true;
    };

#ifdef __EMSCRIPTEN__
    emscripten_set_main_loop_arg(mainUpdate, NULL, 60, true);
#else
    if (g_doInit() == false) {
        printf("Error: failed to initialize audio\n");
        return -2;
    }

    while (true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(1));
        if (g_mainUpdate() == false) break;
    }

    GGWave_deinit();

    // Cleanup
    SDL_CloseAudio();
    SDL_Quit();
#endif

    return 0;
}